

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

int bssl::tls_dispatch_alert(SSL *ssl)

{
  size_t sVar1;
  int iVar2;
  pointer bio;
  size_t in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  int iStack_48;
  int alert;
  uchar *local_40;
  Span<unsigned_char_const> local_38 [8];
  uchar *local_30;
  int local_24;
  undefined1 auStack_20 [4];
  int ret;
  size_t bytes_written;
  SSL *ssl_local;
  
  bytes_written = (size_t)ssl;
  iVar2 = SSL_is_quic(ssl);
  sVar1 = bytes_written;
  if (iVar2 == 0) {
    Span<unsigned_char_const>::Span<2ul>
              (local_38,(uchar (*) [2])(*(long *)(bytes_written + 0x30) + 0x1fd));
    in.size_ = in_R9;
    in.data_ = local_30;
    local_24 = do_tls_write((bssl *)sVar1,(SSL *)auStack_20,(size_t *)0x15,(uint8_t)local_38[0],in);
    if (local_24 < 1) {
      return local_24;
    }
    if (_auStack_20 != (SSL_PROTOCOL_METHOD *)0x2) {
      __assert_fail("bytes_written == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x179,"int bssl::tls_dispatch_alert(SSL *)");
    }
  }
  else {
    iVar2 = (**(code **)(*(long *)(bytes_written + 0x98) + 0x20))
                      (bytes_written,*(undefined4 *)(*(long *)(bytes_written + 0x30) + 0xcc),
                       *(undefined1 *)(*(long *)(bytes_written + 0x30) + 0x1fe));
    if (iVar2 == 0) {
      ERR_put_error(0x10,0,0x12a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x16f);
      return 0;
    }
  }
  *(ushort *)(*(long *)(bytes_written + 0x30) + 0xdc) =
       *(ushort *)(*(long *)(bytes_written + 0x30) + 0xdc) & 0xfbff;
  if (*(char *)(*(long *)(bytes_written + 0x30) + 0x1fd) == '\x02') {
    bio = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)(bytes_written + 0x20));
    BIO_flush(bio);
  }
  sVar1 = bytes_written;
  Span<unsigned_char_const>::Span<2ul>
            ((Span<unsigned_char_const> *)&iStack_48,
             (uchar (*) [2])(*(long *)(bytes_written + 0x30) + 0x1fd));
  in_00.size_ = in_R9;
  in_00.data_ = local_40;
  ssl_do_msg_callback((bssl *)sVar1,(SSL *)0x1,0x15,iStack_48,in_00);
  ssl_do_info_callback
            ((SSL *)bytes_written,0x4008,
             (uint)CONCAT11(*(undefined1 *)(*(long *)(bytes_written + 0x30) + 0x1fd),
                            *(undefined1 *)(*(long *)(bytes_written + 0x30) + 0x1fe)));
  return 1;
}

Assistant:

int tls_dispatch_alert(SSL *ssl) {
  if (SSL_is_quic(ssl)) {
    if (!ssl->quic_method->send_alert(ssl, ssl->s3->quic_write_level,
                                      ssl->s3->send_alert[1])) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_INTERNAL_ERROR);
      return 0;
    }
  } else {
    size_t bytes_written;
    int ret =
        do_tls_write(ssl, &bytes_written, SSL3_RT_ALERT, ssl->s3->send_alert);
    if (ret <= 0) {
      return ret;
    }
    assert(bytes_written == 2);
  }

  ssl->s3->alert_dispatch = false;

  // If the alert is fatal, flush the BIO now.
  if (ssl->s3->send_alert[0] == SSL3_AL_FATAL) {
    BIO_flush(ssl->wbio.get());
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_ALERT, ssl->s3->send_alert);

  int alert = (ssl->s3->send_alert[0] << 8) | ssl->s3->send_alert[1];
  ssl_do_info_callback(ssl, SSL_CB_WRITE_ALERT, alert);

  return 1;
}